

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O0

size_t __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::number_of_nonzero_levels
          (Persistence_landscape_on_grid *this)

{
  size_type sVar1;
  const_reference pvVar2;
  size_type local_20;
  size_t i;
  size_t result;
  Persistence_landscape_on_grid *this_local;
  
  i = 0;
  local_20 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->values_of_landscapes);
    if (local_20 == sVar1) break;
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->values_of_landscapes,local_20);
    sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
    if (i < sVar1) {
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->values_of_landscapes,local_20);
      i = std::vector<double,_std::allocator<double>_>::size(pvVar2);
    }
    local_20 = local_20 + 1;
  }
  return i;
}

Assistant:

size_t number_of_nonzero_levels() const {
    size_t result = 0;
    for (size_t i = 0; i != this->values_of_landscapes.size(); ++i) {
      if (this->values_of_landscapes[i].size() > result) result = this->values_of_landscapes[i].size();
    }
    return result;
  }